

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ForkedPromiseAwaiter<void>::~ForkedPromiseAwaiter(ForkedPromiseAwaiter<void> *this)

{
  PromiseAwaiter<void>::~PromiseAwaiter(&this->awaiter);
  ForkBranchBase::~ForkBranchBase((ForkBranchBase *)this);
  return;
}

Assistant:

ForkedPromiseAwaiter(ForkedPromise<T>& promise)
      : node(promise), awaiter(OwnPromiseNode(&node)) { }